

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_read_tbl(DisasContext_conflict10 *ctx,int gprn,int sprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
    gen_io_start(tcg_ctx);
  }
  local_20 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_load_tbl_ppc64,
                      (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[gprn]),1,&local_20);
  if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
    gen_io_end(tcg_ctx);
    gen_stop_exception(ctx);
  }
  return;
}

Assistant:

static void spr_read_tbl(DisasContext *ctx, int gprn, int sprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_helper_load_tbl(tcg_ctx, cpu_gpr[gprn], tcg_ctx->cpu_env);
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_end(tcg_ctx);
        gen_stop_exception(ctx);
    }
}